

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_meta_push_front_and_push_back.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  bool local_31;
  
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<dyn, dimensions<> > , dimensions<dyn> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x23,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<dyn, dimensions<dyn> > , dimensions<dyn, dyn> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x27,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<dyn, dimensions<dyn, dyn> > , dimensions<dyn, dyn, dyn> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x2b,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<3, dimensions<> > , dimensions<3> >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x30,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<3, dimensions<5> > , dimensions<3, 5> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x34,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<3, dimensions<5, 9> > , dimensions<3, 5, 9> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x38,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<dyn, dimensions<5> > , dimensions<dyn, 5> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x3d,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<5, dimensions<dyn> > , dimensions<5, dyn> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x41,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<dyn, dimensions<5, 9> > , dimensions<dyn, 5, 9> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x46,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<3, dimensions<dyn, 9> > , dimensions<3, dyn, 9> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x4a,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<3, dimensions<5, dyn> > , dimensions<3, 5, dyn> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x4e,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<3, dimensions<dyn, dyn> > , dimensions<3, dyn, dyn> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x53,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<dyn, dimensions<5, dyn> > , dimensions<dyn, 5, dyn> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x57,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<dyn, dimensions<dyn, 9> > , dimensions<dyn, dyn, 9> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x5b,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<dyn, dimensions<> > , dimensions<dyn> >::value)","true"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,100,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<dyn, dimensions<dyn> > , dimensions<dyn, dyn> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x68,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<dyn, dimensions<dyn, dyn> > , dimensions<dyn, dyn, dyn> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x6c,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<3, dimensions<> > , dimensions<3> >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x71,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<5, dimensions<3> > , dimensions<3, 5> >::value)","true"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x75,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<9, dimensions<3, 5> > , dimensions<3, 5, 9> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x79,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<5, dimensions<dyn> > , dimensions<dyn, 5> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x7e,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<dyn, dimensions<5> > , dimensions<5, dyn> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x82,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<9, dimensions<dyn, 5> > , dimensions<dyn, 5, 9> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x87,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<9, dimensions<3, dyn> > , dimensions<3, dyn, 9> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x8b,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<dyn, dimensions<3, 5> > , dimensions<3, 5, dyn> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x8f,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<dyn, dimensions<3, dyn> > , dimensions<3, dyn, dyn> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x94,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<dyn, dimensions<dyn, 5> > , dimensions<dyn, 5, dyn> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x98,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<9, dimensions<dyn, dyn> > , dimensions<dyn, dyn, 9> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x9c,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_front< std::size_t, 0, integer_sequence<std::size_t> >::type , integer_sequence<std::size_t, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xa7,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_front< std::size_t, 0, integer_sequence<std::size_t, 0> >::type , integer_sequence<std::size_t, 0, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xad,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_front< std::size_t, 0, integer_sequence<std::size_t, 0, 0> >::type , integer_sequence<std::size_t, 0, 0, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xb3,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_front< std::size_t, 0, integer_sequence<std::size_t, 1> >::type , integer_sequence<std::size_t, 0, 1> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xba,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_front< std::size_t, 0, integer_sequence<std::size_t, 1, 2> >::type , integer_sequence<std::size_t, 0, 1, 2> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xc0,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_front< int, 3, integer_sequence<int, 5> >::type , integer_sequence<int, 3, 5> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,199,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_front< int, 3, integer_sequence<int, 5, 9> >::type , integer_sequence<int, 3, 5, 9> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xcd,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_back< std::size_t, 0, integer_sequence<std::size_t> >::type , integer_sequence<std::size_t, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xd8,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_back< std::size_t, 0, integer_sequence<std::size_t, 0> >::type , integer_sequence<std::size_t, 0, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xde,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_back< std::size_t, 0, integer_sequence<std::size_t, 0, 0> >::type , integer_sequence<std::size_t, 0, 0, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xe4,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_back< std::size_t, 1, integer_sequence<std::size_t, 0> >::type , integer_sequence<std::size_t, 0, 1> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xeb,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_back< std::size_t, 2, integer_sequence<std::size_t, 0, 1> >::type , integer_sequence<std::size_t, 0, 1, 2> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xf1,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_back< int, 5, integer_sequence<int, 3> >::type , integer_sequence<int, 3, 5> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xf8,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_back< int, 9, integer_sequence<int, 3, 5> >::type , integer_sequence<int, 3, 5, 9> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xfe,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< type_list_push_front<int, type_list<> >::type , type_list<int> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x107,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< type_list_push_front<int, type_list<int> >::type , type_list<int, int> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x10b,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< type_list_push_front<int, type_list<int, int> >::type , type_list<int, int, int> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x10f,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< type_list_push_front<int, type_list<char> >::type , type_list<int, char> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x114,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< type_list_push_front<int, type_list<char, bool> >::type , type_list<int, char, bool> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x118,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< type_list_push_back<int, type_list<> >::type , type_list<int> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x121,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< type_list_push_back<int, type_list<int> >::type , type_list<int, int> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x125,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< type_list_push_back<int, type_list<int, int> >::type , type_list<int, int, int> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x129,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< type_list_push_back<char, type_list<int> >::type , type_list<int, char> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x12e,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< type_list_push_back<bool, type_list<int, char> >::type , type_list<int, char, bool> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x132,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    { // dimensions_push_front {{{

        BOOST_TEST_EQ((is_same<
            dimensions_push_front<dyn, dimensions<> >
          , dimensions<dyn>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_front<dyn, dimensions<dyn> >
          , dimensions<dyn, dyn>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_front<dyn, dimensions<dyn, dyn> >
          , dimensions<dyn, dyn, dyn>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            dimensions_push_front<3, dimensions<> >
          , dimensions<3>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_front<3, dimensions<5> >
          , dimensions<3, 5>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_front<3, dimensions<5, 9> >
          , dimensions<3, 5, 9>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            dimensions_push_front<dyn, dimensions<5> >
          , dimensions<dyn, 5>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_front<5, dimensions<dyn> >
          , dimensions<5, dyn>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            dimensions_push_front<dyn, dimensions<5, 9> >
          , dimensions<dyn, 5, 9>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_front<3, dimensions<dyn, 9> >
          , dimensions<3, dyn, 9>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_front<3, dimensions<5, dyn> >
          , dimensions<3, 5, dyn>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            dimensions_push_front<3, dimensions<dyn, dyn> >
          , dimensions<3, dyn, dyn>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_front<dyn, dimensions<5, dyn> >
          , dimensions<dyn, 5, dyn>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_front<dyn, dimensions<dyn, 9> >
          , dimensions<dyn, dyn, 9>
        >::value), true);

    } // }}}

    { // dimensions_push_back {{{

        BOOST_TEST_EQ((is_same<
            dimensions_push_back<dyn, dimensions<> >
          , dimensions<dyn>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_back<dyn, dimensions<dyn> >
          , dimensions<dyn, dyn>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_back<dyn, dimensions<dyn, dyn> >
          , dimensions<dyn, dyn, dyn>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            dimensions_push_back<3, dimensions<> >
          , dimensions<3>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_back<5, dimensions<3> >
          , dimensions<3, 5>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_back<9, dimensions<3, 5> >
          , dimensions<3, 5, 9>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            dimensions_push_back<5, dimensions<dyn> >
          , dimensions<dyn, 5>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_back<dyn, dimensions<5> >
          , dimensions<5, dyn>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            dimensions_push_back<9, dimensions<dyn, 5> >
          , dimensions<dyn, 5, 9>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_back<9, dimensions<3, dyn> >
          , dimensions<3, dyn, 9>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_back<dyn, dimensions<3, 5> >
          , dimensions<3, 5, dyn>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            dimensions_push_back<dyn, dimensions<3, dyn> >
          , dimensions<3, dyn, dyn>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_back<dyn, dimensions<dyn, 5> >
          , dimensions<dyn, 5, dyn>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_back<9, dimensions<dyn, dyn> >
          , dimensions<dyn, dyn, 9>
        >::value), true);

    } // }}}

    { // integer_sequence_push_front {{{

        BOOST_TEST_EQ((is_same<
            integer_sequence_push_front<
                std::size_t, 0, integer_sequence<std::size_t>
            >::type
          , integer_sequence<std::size_t, 0>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            integer_sequence_push_front<
                std::size_t, 0, integer_sequence<std::size_t, 0>
            >::type
          , integer_sequence<std::size_t, 0, 0>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            integer_sequence_push_front<
                std::size_t, 0, integer_sequence<std::size_t, 0, 0>
            >::type
          , integer_sequence<std::size_t, 0, 0, 0>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            integer_sequence_push_front<
                std::size_t, 0, integer_sequence<std::size_t, 1>
            >::type
          , integer_sequence<std::size_t, 0, 1>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            integer_sequence_push_front<
                std::size_t, 0, integer_sequence<std::size_t, 1, 2>
            >::type
          , integer_sequence<std::size_t, 0, 1, 2>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            integer_sequence_push_front<
                int, 3, integer_sequence<int, 5>
            >::type
          , integer_sequence<int, 3, 5>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            integer_sequence_push_front<
                int, 3, integer_sequence<int, 5, 9>
            >::type
          , integer_sequence<int, 3, 5, 9>
        >::value), true);

    } // }}}

    { // integer_sequence_push_back {{{

        BOOST_TEST_EQ((is_same<
            integer_sequence_push_back<
                std::size_t, 0, integer_sequence<std::size_t>
            >::type
          , integer_sequence<std::size_t, 0>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            integer_sequence_push_back<
                std::size_t, 0, integer_sequence<std::size_t, 0>
            >::type
          , integer_sequence<std::size_t, 0, 0>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            integer_sequence_push_back<
                std::size_t, 0, integer_sequence<std::size_t, 0, 0>
            >::type
          , integer_sequence<std::size_t, 0, 0, 0>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            integer_sequence_push_back<
                std::size_t, 1, integer_sequence<std::size_t, 0>
            >::type
          , integer_sequence<std::size_t, 0, 1>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            integer_sequence_push_back<
                std::size_t, 2, integer_sequence<std::size_t, 0, 1>
            >::type
          , integer_sequence<std::size_t, 0, 1, 2>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            integer_sequence_push_back<
                int, 5, integer_sequence<int, 3>
            >::type
          , integer_sequence<int, 3, 5>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            integer_sequence_push_back<
                int, 9, integer_sequence<int, 3, 5>
            >::type
          , integer_sequence<int, 3, 5, 9>
        >::value), true);

    } // }}}

    { // type_list_push_front {{{

        BOOST_TEST_EQ((is_same<
            type_list_push_front<int, type_list<> >::type
          , type_list<int>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            type_list_push_front<int, type_list<int> >::type
          , type_list<int, int>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            type_list_push_front<int, type_list<int, int> >::type
          , type_list<int, int, int>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            type_list_push_front<int, type_list<char> >::type
          , type_list<int, char>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            type_list_push_front<int, type_list<char, bool> >::type
          , type_list<int, char, bool>
        >::value), true);

    } // }}}

    { // type_list_push_back {{{

        BOOST_TEST_EQ((is_same<
            type_list_push_back<int, type_list<> >::type
          , type_list<int>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            type_list_push_back<int, type_list<int> >::type
          , type_list<int, int>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            type_list_push_back<int, type_list<int, int> >::type
          , type_list<int, int, int>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            type_list_push_back<char, type_list<int> >::type
          , type_list<int, char>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            type_list_push_back<bool, type_list<int, char> >::type
          , type_list<int, char, bool>
        >::value), true);

    } // }}}

    return boost::report_errors();
}